

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

int Saig_StrSimCountMatchedNodes(Aig_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,i);
    if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
      if (p->pReprs == (Aig_Obj_t **)0x0) {
        uVar1 = 0;
      }
      else {
        uVar1 = (uint)(p->pReprs[*(int *)((long)pvVar2 + 0x24)] != (Aig_Obj_t *)0x0);
      }
      iVar3 = iVar3 + uVar1;
    }
  }
  return iVar3;
}

Assistant:

int Saig_StrSimCountMatchedNodes( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjRepr(p, pObj) )
            Counter++;
    return Counter;
}